

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O3

void __thiscall
icu_63::ContractionsAndExpansions::handleCE32
          (ContractionsAndExpansions *this,UChar32 start,UChar32 end,uint32_t ce32)

{
  uint uVar1;
  CollationData *pCVar2;
  uint32_t *puVar3;
  int32_t iVar4;
  _func_int *UNRECOVERED_JUMPTABLE;
  _func_int **pp_Var5;
  int64_t *piVar6;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  UChar32 UVar10;
  ulong uVar11;
  ulong uVar12;
  CESink *pCVar13;
  ulong uVar14;
  UChar local_1de;
  int local_1dc;
  ulong local_1d8;
  UTF16CollationIterator local_1d0;
  
  uVar11 = (ulong)ce32;
  if ((~ce32 & 0xc0) != 0) {
LAB_0023f958:
    pCVar13 = this->sink;
    if (pCVar13 == (CESink *)0x0) {
      return;
    }
    uVar11 = (ulong)(ushort)(ce32 << 8) | CONCAT44(ce32,ce32 << 0x10) & 0xffff0000ff000000;
    UNRECOVERED_JUMPTABLE = pCVar13->_vptr_CESink[2];
    goto LAB_0023f98e;
  }
  pCVar2 = this->data;
  switch(ce32 & 0xf) {
  default:
    goto switchD_0023f956_caseD_0;
  case 1:
switchD_0023f956_caseD_1:
    pCVar13 = this->sink;
    if (pCVar13 == (CESink *)0x0) {
      return;
    }
    uVar11 = (ulong)(ce32 & 0xffffff00) << 0x20 | 0x5000500;
    goto LAB_0023f9f0;
  case 2:
switchD_0023f956_caseD_2:
    pCVar13 = this->sink;
    if (pCVar13 == (CESink *)0x0) {
      return;
    }
    uVar11 = (ulong)(ce32 & 0xffffff00);
LAB_0023f9f0:
    UNRECOVERED_JUMPTABLE = pCVar13->_vptr_CESink[2];
LAB_0023f98e:
    (*UNRECOVERED_JUMPTABLE)(pCVar13,uVar11);
    return;
  case 3:
  case 7:
  case 0xd:
switchD_0023f956_caseD_3:
    if (U_ZERO_ERROR < this->errorCode) {
      return;
    }
    this->errorCode = U_INTERNAL_PROGRAM_ERROR;
    return;
  case 4:
switchD_0023f956_caseD_4:
    pCVar13 = this->sink;
    if (pCVar13 != (CESink *)0x0) {
      piVar6 = this->ces;
      this->ces[0] = (CONCAT44((uint)uVar11,(int)(uVar11 >> 8)) & 0xff0000000000ff00) + 0x5000000;
      this->ces[1] = (ulong)(((uint)uVar11 & 0xff00) << 0x10 | 0x500);
      pp_Var5 = pCVar13->_vptr_CESink;
      uVar9 = 2;
LAB_0023fa4f:
      (*pp_Var5[3])(pCVar13,piVar6,uVar9);
    }
    break;
  case 5:
switchD_0023f956_caseD_5:
    pCVar13 = this->sink;
    if (pCVar13 != (CESink *)0x0) {
      uVar8 = (uint)(uVar11 >> 8) & 0x1f;
      uVar9 = (ulong)uVar8;
      if ((uVar11 & 0x1f00) != 0) {
        puVar3 = pCVar2->ce32s;
        uVar12 = 0;
        do {
          uVar1 = *(uint *)((long)puVar3 + uVar12 * 4 + (ulong)((uint)uVar11 >> 0xb & 0xfffffffc));
          if ((uVar1 & 0xff) < 0xc0) {
            uVar14 = (ulong)((uVar1 & 0xff) << 8) |
                     CONCAT44(uVar1,uVar1 << 0x10) & 0xffff0000ff000000;
          }
          else {
            uVar14 = (ulong)(uVar1 & 0xffffff00);
            if ((uVar1 & 0xf) == 1) {
              uVar14 = uVar14 << 0x20 | 0x5000500;
            }
          }
          this->ces[uVar12] = uVar14;
          uVar12 = uVar12 + 1;
        } while (uVar8 != uVar12);
      }
      piVar6 = this->ces;
      pp_Var5 = pCVar13->_vptr_CESink;
      goto LAB_0023fa4f;
    }
    break;
  case 6:
switchD_0023f956_caseD_6:
    pCVar13 = this->sink;
    if (pCVar13 != (CESink *)0x0) {
      uVar9 = (ulong)((uint)(uVar11 >> 8) & 0x1f);
      piVar6 = (int64_t *)((ulong)((uint)uVar11 >> 10 & 0xfffffff8) + (long)pCVar2->ces);
      pp_Var5 = pCVar13->_vptr_CESink;
      goto LAB_0023fa4f;
    }
    break;
  case 8:
switchD_0023f956_caseD_8:
    handlePrefixes(this,start,end,ce32);
    return;
  case 9:
switchD_0023f956_caseD_9:
    handleContractions(this,start,end,ce32);
    return;
  case 10:
switchD_0023f956_caseD_a:
    puVar7 = (uint *)((ulong)((uint)(uVar11 >> 0xb) & 0x1ffffc) + (long)pCVar2->ce32s);
    do {
      ce32 = *puVar7;
      uVar11 = (ulong)ce32;
      if ((~ce32 & 0xc0) != 0) goto LAB_0023f958;
      switch(ce32 & 0xf) {
      default:
        goto switchD_0023f956_caseD_0;
      case 1:
        goto switchD_0023f956_caseD_1;
      case 2:
        goto switchD_0023f956_caseD_2;
      case 3:
      case 7:
      case 0xd:
        goto switchD_0023f956_caseD_3;
      case 4:
        goto switchD_0023f956_caseD_4;
      case 5:
        goto switchD_0023f956_caseD_5;
      case 6:
        goto switchD_0023f956_caseD_6;
      case 8:
        goto switchD_0023f956_caseD_8;
      case 9:
        goto switchD_0023f956_caseD_9;
      case 10:
        goto switchD_0023f956_caseD_a;
      case 0xb:
switchD_0023f956_caseD_b:
        puVar7 = pCVar2->ce32s;
        break;
      case 0xc:
        goto switchD_0023f956_caseD_c;
      }
    } while( true );
  case 0xb:
    goto switchD_0023f956_caseD_b;
  case 0xc:
switchD_0023f956_caseD_c:
    if (this->sink != (CESink *)0x0) {
      local_1d0.super_CollationIterator.trie = pCVar2->trie;
      local_1d0.super_CollationIterator.ceBuffer.buffer.ptr =
           local_1d0.super_CollationIterator.ceBuffer.buffer.stackArray;
      local_1d0.super_CollationIterator.ceBuffer.length = 0;
      local_1d0.super_CollationIterator.ceBuffer.buffer.capacity = 0x28;
      local_1d0.super_CollationIterator.ceBuffer.buffer.needToRelease = '\0';
      local_1d0.super_CollationIterator.cesIndex = 0;
      local_1d0.super_CollationIterator.skipped = (SkippedState *)0x0;
      local_1d0.super_CollationIterator.numCpFwd = -1;
      local_1d0.super_CollationIterator.isNumeric = '\0';
      local_1d0.super_CollationIterator.super_UObject._vptr_UObject =
           (_func_int **)&PTR__UTF16CollationIterator_003b1e40;
      local_1d0.start = (UChar *)0x0;
      local_1d0.pos = (UChar *)0x0;
      local_1d0.limit = (UChar *)0x0;
      local_1d8 = (ulong)(uint)end;
      local_1d0.super_CollationIterator.data = pCVar2;
      if (start <= end) {
        local_1dc = end + 1;
        UVar10 = start;
        do {
          local_1de = (UChar)UVar10;
          CollationIterator::reset(&local_1d0.super_CollationIterator);
          local_1d0.start = &local_1de;
          local_1d0.limit = (UChar *)&local_1dc;
          local_1d0.pos = local_1d0.start;
          iVar4 = CollationIterator::fetchCEs(&local_1d0.super_CollationIterator,&this->errorCode);
          if (U_ZERO_ERROR < this->errorCode) {
            UTF16CollationIterator::~UTF16CollationIterator(&local_1d0);
            return;
          }
          (*this->sink->_vptr_CESink[3])
                    (this->sink,local_1d0.super_CollationIterator.ceBuffer.buffer.ptr,
                     (ulong)(iVar4 - 1));
          UVar10 = UVar10 + 1;
        } while (local_1dc != UVar10);
      }
      UTF16CollationIterator::~UTF16CollationIterator(&local_1d0);
      end = (UChar32)local_1d8;
    }
    if (0x1f < (ushort)(this->unreversedPrefix).fUnion.fStackFields.fLengthAndFlags) {
      return;
    }
    addExpansions(this,start,end);
    return;
  }
  if ((ushort)(this->unreversedPrefix).fUnion.fStackFields.fLengthAndFlags < 0x20) {
    addExpansions(this,start,end);
    return;
  }
switchD_0023f956_caseD_0:
  return;
}

Assistant:

void
ContractionsAndExpansions::handleCE32(UChar32 start, UChar32 end, uint32_t ce32) {
    for(;;) {
        if((ce32 & 0xff) < Collation::SPECIAL_CE32_LOW_BYTE) {
            // !isSpecialCE32()
            if(sink != NULL) {
                sink->handleCE(Collation::ceFromSimpleCE32(ce32));
            }
            return;
        }
        switch(Collation::tagFromCE32(ce32)) {
        case Collation::FALLBACK_TAG:
            return;
        case Collation::RESERVED_TAG_3:
        case Collation::BUILDER_DATA_TAG:
        case Collation::LEAD_SURROGATE_TAG:
            if(U_SUCCESS(errorCode)) { errorCode = U_INTERNAL_PROGRAM_ERROR; }
            return;
        case Collation::LONG_PRIMARY_TAG:
            if(sink != NULL) {
                sink->handleCE(Collation::ceFromLongPrimaryCE32(ce32));
            }
            return;
        case Collation::LONG_SECONDARY_TAG:
            if(sink != NULL) {
                sink->handleCE(Collation::ceFromLongSecondaryCE32(ce32));
            }
            return;
        case Collation::LATIN_EXPANSION_TAG:
            if(sink != NULL) {
                ces[0] = Collation::latinCE0FromCE32(ce32);
                ces[1] = Collation::latinCE1FromCE32(ce32);
                sink->handleExpansion(ces, 2);
            }
            // Optimization: If we have a prefix,
            // then the relevant strings have been added already.
            if(unreversedPrefix.isEmpty()) {
                addExpansions(start, end);
            }
            return;
        case Collation::EXPANSION32_TAG:
            if(sink != NULL) {
                const uint32_t *ce32s = data->ce32s + Collation::indexFromCE32(ce32);
                int32_t length = Collation::lengthFromCE32(ce32);
                for(int32_t i = 0; i < length; ++i) {
                    ces[i] = Collation::ceFromCE32(*ce32s++);
                }
                sink->handleExpansion(ces, length);
            }
            // Optimization: If we have a prefix,
            // then the relevant strings have been added already.
            if(unreversedPrefix.isEmpty()) {
                addExpansions(start, end);
            }
            return;
        case Collation::EXPANSION_TAG:
            if(sink != NULL) {
                int32_t length = Collation::lengthFromCE32(ce32);
                sink->handleExpansion(data->ces + Collation::indexFromCE32(ce32), length);
            }
            // Optimization: If we have a prefix,
            // then the relevant strings have been added already.
            if(unreversedPrefix.isEmpty()) {
                addExpansions(start, end);
            }
            return;
        case Collation::PREFIX_TAG:
            handlePrefixes(start, end, ce32);
            return;
        case Collation::CONTRACTION_TAG:
            handleContractions(start, end, ce32);
            return;
        case Collation::DIGIT_TAG:
            // Fetch the non-numeric-collation CE32 and continue.
            ce32 = data->ce32s[Collation::indexFromCE32(ce32)];
            break;
        case Collation::U0000_TAG:
            U_ASSERT(start == 0 && end == 0);
            // Fetch the normal ce32 for U+0000 and continue.
            ce32 = data->ce32s[0];
            break;
        case Collation::HANGUL_TAG:
            if(sink != NULL) {
                // TODO: This should be optimized,
                // especially if [start..end] is the complete Hangul range. (assert that)
                UTF16CollationIterator iter(data, FALSE, NULL, NULL, NULL);
                UChar hangul[1] = { 0 };
                for(UChar32 c = start; c <= end; ++c) {
                    hangul[0] = (UChar)c;
                    iter.setText(hangul, hangul + 1);
                    int32_t length = iter.fetchCEs(errorCode);
                    if(U_FAILURE(errorCode)) { return; }
                    // Ignore the terminating non-CE.
                    U_ASSERT(length >= 2 && iter.getCE(length - 1) == Collation::NO_CE);
                    sink->handleExpansion(iter.getCEs(), length - 1);
                }
            }
            // Optimization: If we have a prefix,
            // then the relevant strings have been added already.
            if(unreversedPrefix.isEmpty()) {
                addExpansions(start, end);
            }
            return;
        case Collation::OFFSET_TAG:
            // Currently no need to send offset CEs to the sink.
            return;
        case Collation::IMPLICIT_TAG:
            // Currently no need to send implicit CEs to the sink.
            return;
        }
    }
}